

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O2

void __thiscall pixels::fillPattern2(pixels *this)

{
  int x;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  half local_66;
  half local_64;
  half local_62;
  double local_60;
  int local_54;
  double local_50;
  double local_48;
  ulong local_40;
  double local_38;
  
  for (local_40 = 0; (int)local_40 < this->_h; local_40 = (ulong)((int)local_40 + 1)) {
    local_48 = (double)(int)local_40;
    local_54 = (int)(local_40 % 100) * 100;
    local_50 = local_48 * 0.5;
    for (uVar1 = 0; (long)uVar1 < (long)this->_w; uVar1 = uVar1 + 1) {
      lVar2 = (long)(this->_stride_x * (int)local_40 + (int)uVar1);
      (this->i).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar2] = (int)((uVar1 & 0xffffffff) % 100) + local_54;
      local_38 = sin(local_48);
      local_60 = (double)(int)uVar1;
      dVar5 = sin(local_60 * 0.5);
      Imath_3_2::half::half(&local_62,(float)(dVar5 + local_38));
      (this->f).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar2] = (float)local_62._h;
      local_60 = sin(local_60);
      dVar5 = sin(local_50);
      Imath_3_2::half::half(&local_64,(float)(dVar5 + local_60));
      (this->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[lVar2] = local_64._h;
      uVar3 = uVar1 & 0xffffffff;
      for (lVar4 = -0x60; lVar4 != 0; lVar4 = lVar4 + 0x18) {
        local_60 = sin((double)(int)uVar3);
        dVar5 = sin(local_50);
        Imath_3_2::half::half(&local_66,(float)(dVar5 + local_60));
        *(uint16_t *)(*(long *)((long)this[1].rgba + lVar4 + -0x58) + lVar2 * 2) = local_66._h;
        uVar3 = (ulong)((int)uVar3 + 1);
      }
    }
  }
  return;
}

Assistant:

void fillPattern2 ()
    {
        for (int y = 0; y < _h; ++y)
        {
            for (int x = 0; x < _w; ++x)
            {
                size_t idx = y * _stride_x + x;
                i[idx]     = x % 100 + 100 * (y % 100);
                f[idx] =
                    half (sin (double (y)) + sin (double (x) * 0.5)).bits ();
                h[idx] =
                    half (sin (double (x)) + sin (double (y) * 0.5)).bits ();
                for (int c = 0; c < 4; ++c)
                    rgba[c][idx] =
                        half (sin (double (x + c)) + sin (double (y) * 0.5))
                            .bits ();
            }
        }
    }